

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void __thiscall
crnlib::dxt1_endpoint_optimizer::try_combinatorial_encoding(dxt1_endpoint_optimizer *this)

{
  unique_color_vec *this_00;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint16 uVar4;
  void *pvVar5;
  ulong uVar6;
  undefined8 uVar7;
  unsigned_short *puVar8;
  uint64 uVar9;
  unsigned_short *puVar10;
  int iVar11;
  unique_color *puVar12;
  unique_color *a;
  uint uVar13;
  uint i;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  uint64 uVar19;
  uint16 packed_color;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_50;
  uint local_4c;
  ulong local_48;
  elemental_vector *local_40;
  uint local_38;
  uint local_34;
  
  uVar13 = (this->m_unique_colors).m_size;
  if (uVar13 - 5 < 0xfffffffd) {
    return;
  }
  this_00 = &this->m_temp_unique_colors;
  if ((this->m_temp_unique_colors).m_capacity < uVar13) {
    if (this_00->m_p != (unique_color *)0x0) {
      crnlib_free(this_00->m_p);
      this_00->m_p = (unique_color *)0x0;
      (this->m_temp_unique_colors).m_size = 0;
      (this->m_temp_unique_colors).m_capacity = 0;
      uVar13 = (this->m_unique_colors).m_size;
    }
    elemental_vector::increase_capacity
              ((elemental_vector *)this_00,uVar13,false,8,(object_mover)0x0,false);
    uVar13 = (this->m_unique_colors).m_size;
  }
  else if ((this->m_temp_unique_colors).m_size != 0) {
    (this->m_temp_unique_colors).m_size = 0;
  }
  a = (this->m_unique_colors).m_p;
  local_40 = (elemental_vector *)this_00;
  pvVar5 = memcpy((this->m_temp_unique_colors).m_p,a,(ulong)uVar13 << 3);
  uVar13 = (this->m_unique_colors).m_size;
  (this->m_temp_unique_colors).m_size = uVar13;
  if (uVar13 == 2) {
    local_48 = 0;
    uVar7 = CONCAT71((int7)((ulong)pvVar5 >> 8),1);
    uVar13 = 2;
    do {
      local_38 = (uint)uVar7;
      uVar7 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
      lVar14 = 0;
      do {
        local_34 = (uint)uVar7;
        puVar12 = (this->m_temp_unique_colors).m_p;
        uVar2 = (uint)lVar14 ^ 1;
        lerp_color((dxt1_endpoint_optimizer *)&local_50.field_0,&a->m_color,&puVar12[lVar14].m_color
                   ,2.0,uVar2 * 8 + (int)puVar12);
        if ((this->m_temp_unique_colors).m_capacity <= uVar13) {
          a = (unique_color *)(ulong)(uVar13 + 1);
          elemental_vector::increase_capacity(local_40,uVar13 + 1,true,8,(object_mover)0x0,false);
          uVar13 = (this->m_temp_unique_colors).m_size;
          puVar12 = (this->m_temp_unique_colors).m_p;
        }
        puVar12[uVar13].m_color.field_0 = local_50;
        puVar12[uVar13].m_weight = local_4c;
        uVar1 = (this->m_temp_unique_colors).m_size;
        uVar13 = uVar1 + 1;
        (this->m_temp_unique_colors).m_size = uVar13;
        puVar12 = (this->m_temp_unique_colors).m_p;
        lerp_color((dxt1_endpoint_optimizer *)&local_50.field_0,&a->m_color,&puVar12[lVar14].m_color
                   ,3.0,(int)puVar12 + uVar2 * 8);
        if ((this->m_temp_unique_colors).m_capacity <= uVar13) {
          uVar13 = uVar1 + 2;
          a = (unique_color *)(ulong)uVar13;
          elemental_vector::increase_capacity(local_40,uVar13,true,8,(object_mover)0x0,false);
          uVar13 = (this->m_temp_unique_colors).m_size;
          puVar12 = (this->m_temp_unique_colors).m_p;
        }
        puVar12[uVar13].m_color.field_0 = local_50;
        puVar12[uVar13].m_weight = local_4c;
        uVar1 = (this->m_temp_unique_colors).m_size;
        uVar13 = uVar1 + 1;
        (this->m_temp_unique_colors).m_size = uVar13;
        puVar12 = (this->m_temp_unique_colors).m_p;
        lerp_color((dxt1_endpoint_optimizer *)&local_50.field_0,&a->m_color,&puVar12[lVar14].m_color
                   ,0.5,(int)puVar12 + uVar2 * 8);
        if ((this->m_temp_unique_colors).m_capacity <= uVar13) {
          uVar13 = uVar1 + 2;
          a = (unique_color *)(ulong)uVar13;
          elemental_vector::increase_capacity(local_40,uVar13,true,8,(object_mover)0x0,false);
          uVar13 = (this->m_temp_unique_colors).m_size;
          puVar12 = (this->m_temp_unique_colors).m_p;
        }
        puVar12[uVar13].m_color.field_0 = local_50;
        puVar12[uVar13].m_weight = local_4c;
        uVar1 = (this->m_temp_unique_colors).m_size;
        uVar13 = uVar1 + 1;
        (this->m_temp_unique_colors).m_size = uVar13;
        puVar12 = (this->m_temp_unique_colors).m_p;
        lerp_color((dxt1_endpoint_optimizer *)&local_50.field_0,&a->m_color,&puVar12[lVar14].m_color
                   ,1.5,(int)puVar12 + uVar2 * 8);
        if ((this->m_temp_unique_colors).m_capacity <= uVar13) {
          uVar13 = uVar1 + 2;
          a = (unique_color *)(ulong)uVar13;
          elemental_vector::increase_capacity(local_40,uVar13,true,8,(object_mover)0x0,false);
          uVar13 = (this->m_temp_unique_colors).m_size;
          puVar12 = (this->m_temp_unique_colors).m_p;
        }
        puVar12[uVar13].m_color.field_0 = local_50;
        puVar12[uVar13].m_weight = local_4c;
        uVar1 = (this->m_temp_unique_colors).m_size;
        uVar13 = uVar1 + 1;
        (this->m_temp_unique_colors).m_size = uVar13;
        puVar12 = (this->m_temp_unique_colors).m_p;
        lerp_color((dxt1_endpoint_optimizer *)&local_50.field_0,&a->m_color,&puVar12[lVar14].m_color
                   ,-1.0,(int)puVar12 + uVar2 * 8);
        if ((this->m_temp_unique_colors).m_capacity <= uVar13) {
          uVar13 = uVar1 + 2;
          a = (unique_color *)(ulong)uVar13;
          elemental_vector::increase_capacity(local_40,uVar13,true,8,(object_mover)0x0,false);
          uVar13 = (this->m_temp_unique_colors).m_size;
          puVar12 = (this->m_temp_unique_colors).m_p;
        }
        puVar12[uVar13].m_color.field_0 = local_50;
        puVar12[uVar13].m_weight = local_4c;
        uVar1 = (this->m_temp_unique_colors).m_size;
        uVar13 = uVar1 + 1;
        (this->m_temp_unique_colors).m_size = uVar13;
        puVar12 = (this->m_temp_unique_colors).m_p;
        lerp_color((dxt1_endpoint_optimizer *)&local_50.field_0,&a->m_color,&puVar12[lVar14].m_color
                   ,2.0,(int)puVar12 + uVar2 * 8);
        if ((this->m_temp_unique_colors).m_capacity <= uVar13) {
          uVar13 = uVar1 + 2;
          a = (unique_color *)(ulong)uVar13;
          elemental_vector::increase_capacity(local_40,uVar13,true,8,(object_mover)0x0,false);
          uVar13 = (this->m_temp_unique_colors).m_size;
          puVar12 = (this->m_temp_unique_colors).m_p;
        }
        puVar12[uVar13].m_color.field_0 = local_50;
        puVar12[uVar13].m_weight = local_4c;
        uVar1 = (this->m_temp_unique_colors).m_size;
        uVar13 = uVar1 + 1;
        (this->m_temp_unique_colors).m_size = uVar13;
        puVar12 = (this->m_temp_unique_colors).m_p;
        lerp_color((dxt1_endpoint_optimizer *)&local_50.field_0,&a->m_color,&puVar12[lVar14].m_color
                   ,-0.5,(int)puVar12 + uVar2 * 8);
        if ((this->m_temp_unique_colors).m_capacity <= uVar13) {
          uVar13 = uVar1 + 2;
          a = (unique_color *)(ulong)uVar13;
          elemental_vector::increase_capacity(local_40,uVar13,true,8,(object_mover)0x0,false);
          uVar13 = (this->m_temp_unique_colors).m_size;
          puVar12 = (this->m_temp_unique_colors).m_p;
        }
        puVar12[uVar13].m_color.field_0 = local_50;
        puVar12[uVar13].m_weight = local_4c;
        uVar1 = (this->m_temp_unique_colors).m_size;
        uVar13 = uVar1 + 1;
        (this->m_temp_unique_colors).m_size = uVar13;
        puVar12 = (this->m_temp_unique_colors).m_p;
        lerp_color((dxt1_endpoint_optimizer *)&local_50.field_0,&a->m_color,&puVar12[lVar14].m_color
                   ,0.5,(int)puVar12 + uVar2 * 8);
        if ((this->m_temp_unique_colors).m_capacity <= uVar13) {
          uVar13 = uVar1 + 2;
          a = (unique_color *)(ulong)uVar13;
          elemental_vector::increase_capacity(local_40,uVar13,true,8,(object_mover)0x0,false);
          uVar13 = (this->m_temp_unique_colors).m_size;
          puVar12 = (this->m_temp_unique_colors).m_p;
        }
        puVar12[uVar13].m_color.field_0 = local_50;
        puVar12[uVar13].m_weight = local_4c;
        uVar1 = (this->m_temp_unique_colors).m_size;
        uVar13 = uVar1 + 1;
        (this->m_temp_unique_colors).m_size = uVar13;
        puVar12 = (this->m_temp_unique_colors).m_p;
        lerp_color((dxt1_endpoint_optimizer *)&local_50.field_0,&a->m_color,&puVar12[lVar14].m_color
                   ,-2.0,(int)puVar12 + uVar2 * 8);
        if ((this->m_temp_unique_colors).m_capacity <= uVar13) {
          uVar13 = uVar1 + 2;
          a = (unique_color *)(ulong)uVar13;
          elemental_vector::increase_capacity(local_40,uVar13,true,8,(object_mover)0x0,false);
          uVar13 = (this->m_temp_unique_colors).m_size;
          puVar12 = (this->m_temp_unique_colors).m_p;
        }
        puVar12[uVar13].m_color.field_0 = local_50;
        puVar12[uVar13].m_weight = local_4c;
        uVar1 = (this->m_temp_unique_colors).m_size;
        uVar17 = uVar1 + 1;
        (this->m_temp_unique_colors).m_size = uVar17;
        puVar12 = (this->m_temp_unique_colors).m_p;
        lerp_color((dxt1_endpoint_optimizer *)&local_50.field_0,&a->m_color,&puVar12[lVar14].m_color
                   ,-1.0,(int)puVar12 + uVar2 * 8);
        if ((this->m_temp_unique_colors).m_capacity <= uVar17) {
          uVar13 = uVar1 + 2;
          a = (unique_color *)(ulong)uVar13;
          elemental_vector::increase_capacity(local_40,uVar13,true,8,(object_mover)0x0,false);
          uVar17 = (this->m_temp_unique_colors).m_size;
          puVar12 = (this->m_temp_unique_colors).m_p;
        }
        puVar12[uVar17].m_color.field_0.m_u32 = (uint32)local_50;
        puVar12[uVar17].m_weight = local_4c;
        uVar13 = (this->m_temp_unique_colors).m_size + 1;
        (this->m_temp_unique_colors).m_size = uVar13;
        lVar14 = 1;
        uVar7 = 0;
      } while ((local_34 & 1) != 0);
      local_48 = 1;
      uVar7 = 0;
    } while ((local_38 & 1) != 0);
  }
  else if (uVar13 == 3) {
    uVar13 = 3;
    uVar6 = 0;
    lVar14 = 0;
    do {
      lVar18 = 0;
      local_48 = uVar6;
      do {
        if (uVar6 != lVar18) {
          puVar12 = (this->m_temp_unique_colors).m_p;
          iVar11 = (int)lVar18;
          lerp_color((dxt1_endpoint_optimizer *)&local_50.field_0,&a->m_color,
                     &puVar12[lVar14].m_color,1.5,(int)puVar12 + iVar11);
          if ((this->m_temp_unique_colors).m_capacity <= uVar13) {
            a = (unique_color *)(ulong)(uVar13 + 1);
            elemental_vector::increase_capacity(local_40,uVar13 + 1,true,8,(object_mover)0x0,false);
            uVar13 = (this->m_temp_unique_colors).m_size;
            puVar12 = (this->m_temp_unique_colors).m_p;
          }
          puVar12[uVar13].m_color.field_0 = local_50;
          puVar12[uVar13].m_weight = local_4c;
          uVar1 = (this->m_temp_unique_colors).m_size;
          uVar13 = uVar1 + 1;
          (this->m_temp_unique_colors).m_size = uVar13;
          puVar12 = (this->m_temp_unique_colors).m_p;
          lerp_color((dxt1_endpoint_optimizer *)&local_50.field_0,&a->m_color,
                     &puVar12[lVar14].m_color,0.6666667,(int)puVar12 + iVar11);
          if ((this->m_temp_unique_colors).m_capacity <= uVar13) {
            uVar13 = uVar1 + 2;
            a = (unique_color *)(ulong)uVar13;
            elemental_vector::increase_capacity(local_40,uVar13,true,8,(object_mover)0x0,false);
            uVar13 = (this->m_temp_unique_colors).m_size;
            puVar12 = (this->m_temp_unique_colors).m_p;
          }
          puVar12[uVar13].m_color.field_0 = local_50;
          puVar12[uVar13].m_weight = local_4c;
          uVar1 = (this->m_temp_unique_colors).m_size;
          uVar13 = uVar1 + 1;
          (this->m_temp_unique_colors).m_size = uVar13;
          puVar12 = (this->m_temp_unique_colors).m_p;
          lerp_color((dxt1_endpoint_optimizer *)&local_50.field_0,&a->m_color,
                     &puVar12[lVar14].m_color,0.33333334,(int)puVar12 + iVar11);
          if ((this->m_temp_unique_colors).m_capacity <= uVar13) {
            uVar13 = uVar1 + 2;
            a = (unique_color *)(ulong)uVar13;
            elemental_vector::increase_capacity(local_40,uVar13,true,8,(object_mover)0x0,false);
            uVar13 = (this->m_temp_unique_colors).m_size;
            puVar12 = (this->m_temp_unique_colors).m_p;
          }
          puVar12[uVar13].m_color.field_0 = local_50;
          puVar12[uVar13].m_weight = local_4c;
          uVar1 = (this->m_temp_unique_colors).m_size;
          uVar17 = uVar1 + 1;
          (this->m_temp_unique_colors).m_size = uVar17;
          puVar12 = (this->m_temp_unique_colors).m_p;
          lerp_color((dxt1_endpoint_optimizer *)&local_50.field_0,&a->m_color,
                     &puVar12[lVar14].m_color,-0.5,(int)puVar12 + iVar11);
          if ((this->m_temp_unique_colors).m_capacity <= uVar17) {
            uVar13 = uVar1 + 2;
            a = (unique_color *)(ulong)uVar13;
            elemental_vector::increase_capacity(local_40,uVar13,true,8,(object_mover)0x0,false);
            uVar17 = (this->m_temp_unique_colors).m_size;
            puVar12 = (this->m_temp_unique_colors).m_p;
          }
          puVar12[uVar17].m_color.field_0.m_u32 = (uint32)local_50;
          puVar12[uVar17].m_weight = local_4c;
          uVar13 = (this->m_temp_unique_colors).m_size + 1;
          (this->m_temp_unique_colors).m_size = uVar13;
          uVar6 = local_48;
        }
        lVar18 = lVar18 + 8;
      } while (lVar18 != 0x18);
      lVar14 = lVar14 + 1;
      uVar6 = uVar6 + 8;
    } while (lVar14 != 3);
  }
  if ((this->m_unique_packed_colors).m_size != 0) {
    (this->m_unique_packed_colors).m_size = 0;
  }
  if (uVar13 == 0) {
    uVar6 = 0;
  }
  else {
    lVar14 = 0;
    uVar15 = 0;
    do {
      uVar4 = dxt1_block::pack_color
                        ((color_quad_u8 *)
                         ((long)&(((this->m_temp_unique_colors).m_p)->m_color).field_0 + lVar14),
                         true,0x7f);
      local_50.m_u32._0_2_ = uVar4;
      puVar10 = (this->m_unique_packed_colors).m_p;
      puVar8 = std::
               __find_if<unsigned_short*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                         (puVar10,puVar10 + (this->m_unique_packed_colors).m_size,&local_50);
      puVar10 = (this->m_unique_packed_colors).m_p;
      uVar13 = (this->m_unique_packed_colors).m_size;
      uVar6 = (ulong)uVar13;
      if (puVar8 == puVar10 + uVar6) {
        if ((this->m_unique_packed_colors).m_capacity <= uVar13) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_unique_packed_colors,uVar13 + 1,true,2,
                     (object_mover)0x0,false);
          uVar6 = (ulong)(this->m_unique_packed_colors).m_size;
          puVar10 = (this->m_unique_packed_colors).m_p;
        }
        puVar10[uVar6] = local_50.m_u32._0_2_;
        uVar13 = (this->m_unique_packed_colors).m_size + 1;
        uVar6 = (ulong)uVar13;
        (this->m_unique_packed_colors).m_size = uVar13;
      }
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + 8;
    } while (uVar15 < (this->m_temp_unique_colors).m_size);
  }
  uVar19 = (this->m_best_solution).m_error;
  if (uVar19 == 0) {
    return;
  }
  uVar15 = 1;
  uVar16 = 0;
  do {
    if ((int)uVar6 - 1 <= uVar16) {
      (this->m_best_solution).m_error = 1;
      uVar15 = 1;
      uVar9 = 1;
      uVar16 = 0;
      do {
        if ((int)uVar6 - 1 <= uVar16) {
          (this->m_best_solution).m_error = uVar19;
          return;
        }
        local_48 = uVar16 + 1;
        iVar11 = (int)uVar15;
        if (local_48 < uVar6) {
          do {
            uVar3 = uVar15 + 1;
            puVar10 = (this->m_unique_packed_colors).m_p;
            local_50.m_u32._2_2_ = puVar10[uVar15];
            local_50.m_u32._0_2_ = puVar10[uVar16];
            evaluate_solution(this,(dxt1_solution_coordinates *)&local_50.field_0,true);
            uVar9 = (this->m_best_solution).m_error;
            uVar6 = (ulong)(this->m_unique_packed_colors).m_size;
            if (uVar9 == 0) break;
            uVar15 = uVar3;
          } while (uVar3 < uVar6);
        }
        uVar15 = (ulong)(iVar11 + 1);
        uVar16 = local_48;
        if (uVar9 == 0) {
          return;
        }
      } while( true );
    }
    local_48 = uVar16 + 1;
    iVar11 = (int)uVar15;
    if (local_48 < uVar6) {
      do {
        uVar3 = uVar15 + 1;
        puVar10 = (this->m_unique_packed_colors).m_p;
        local_50.m_u32._2_2_ = puVar10[uVar15];
        local_50.m_u32._0_2_ = puVar10[uVar16];
        evaluate_solution(this,(dxt1_solution_coordinates *)&local_50.field_0,false);
        uVar19 = (this->m_best_solution).m_error;
        uVar6 = (ulong)(this->m_unique_packed_colors).m_size;
        if (uVar19 == 0) break;
        uVar15 = uVar3;
      } while (uVar3 < uVar6);
    }
    uVar15 = (ulong)(iVar11 + 1);
    uVar16 = local_48;
    if (uVar19 == 0) {
      return;
    }
  } while( true );
}

Assistant:

inline uint size() const
        {
            return m_size;
        }